

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

TestLog * tcu::operator<<(TestLog *log,exception *e)

{
  MessageBuilder *this;
  TestLog *pTVar1;
  char *local_1a0;
  MessageBuilder local_198;
  exception *local_18;
  exception *e_local;
  TestLog *log_local;
  
  local_18 = e;
  e_local = (exception *)log;
  TestLog::operator<<(&local_198,log,(BeginMessageToken *)&TestLog::Message);
  local_1a0 = (char *)(**(code **)(*(long *)local_18 + 0x10))();
  this = MessageBuilder::operator<<(&local_198,&local_1a0);
  pTVar1 = MessageBuilder::operator<<(this,(EndMessageToken *)&TestLog::EndMessage);
  MessageBuilder::~MessageBuilder(&local_198);
  return pTVar1;
}

Assistant:

inline TestLog& operator<< (TestLog& log, const std::exception& e)
{
	// \todo [2012-10-18 pyry] Print type info?
	return log << TestLog::Message << e.what() << TestLog::EndMessage;
}